

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

Dictionary * __thiscall
nvim::Nvim::win_get_config_abi_cxx11_(Dictionary *__return_storage_ptr__,Nvim *this,Window window)

{
  allocator local_49;
  string local_48;
  undefined1 local_21;
  Window local_20;
  Window window_local;
  Nvim *this_local;
  Dictionary *res;
  
  local_21 = 0;
  local_20 = window;
  window_local = (Window)this;
  this_local = (Nvim *)__return_storage_ptr__;
  std::
  multimap<msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_std::less<msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>,_std::allocator<std::pair<const_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>_>_>
  ::multimap(__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"nvim_win_get_config",&local_49);
  NvimRPC::
  call<std::multimap<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,std::less<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>,std::allocator<std::pair<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>const,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>>>,long>
            (&this->client_,&local_48,__return_storage_ptr__,&local_20);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return __return_storage_ptr__;
}

Assistant:

Dictionary Nvim::win_get_config(Window window) {
    Dictionary res;
    client_.call("nvim_win_get_config", res, window);
    return res;
}